

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_float.h
# Opt level: O1

void duckdb_fast_float::detail::decimal_left_shift(decimal *h,uint32_t shift)

{
  bool bVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  
  uVar8 = h->num_digits;
  if ((ulong)uVar8 != 0) {
    uVar2 = *(ushort *)
             (number_of_digits_decimal_left_shift(duckdb_fast_float::decimal_const&,unsigned_int)::
              number_of_digits_decimal_left_shift_table + (ulong)(shift & 0x3f) * 2) >> 0xb;
    uVar9 = (uint)uVar2;
    uVar3 = *(ushort *)
             (number_of_digits_decimal_left_shift(duckdb_fast_float::decimal_const&,unsigned_int)::
              number_of_digits_decimal_left_shift_table + (ulong)(shift & 0x3f) * 2) & 0x7ff;
    uVar5 = (*(ushort *)
              (number_of_digits_decimal_left_shift(duckdb_fast_float::decimal_const&,unsigned_int)::
               number_of_digits_decimal_left_shift_table + (ulong)(shift & 0x3f) * 2 + 2) & 0x7ff) -
            uVar3;
    uVar10 = (uint)uVar2;
    if (uVar5 != 0) {
      uVar6 = 0;
      do {
        if (uVar8 == uVar6) {
          uVar10 = uVar9 - 1;
          break;
        }
        if (h->digits[uVar6] !=
            number_of_digits_decimal_left_shift(duckdb_fast_float::decimal_const&,unsigned_int)::
            number_of_digits_decimal_left_shift_table_powers_of_5[uVar6 + uVar3]) {
          uVar10 = uVar9 - (h->digits[uVar6] <
                           (byte)number_of_digits_decimal_left_shift(duckdb_fast_float::decimal_const&,unsigned_int)
                                 ::number_of_digits_decimal_left_shift_table_powers_of_5
                                 [uVar6 + uVar3]);
          break;
        }
        uVar6 = uVar6 + 1;
        uVar10 = uVar9;
      } while (uVar5 != uVar6);
    }
    uVar3 = (uVar10 - 1) + uVar8;
    if ((int)(uVar8 - 1) < 0) {
      uVar6 = 0;
    }
    else {
      uVar6 = 0;
      uVar11 = (ulong)(uVar8 - 1);
      do {
        uVar7 = ((ulong)h->digits[uVar11] << ((byte)shift & 0x3f)) + uVar6;
        uVar6 = uVar7 / 10;
        uVar7 = uVar7 % 10;
        if (uVar3 < 0x300) {
          h->digits[uVar3] = (uint8_t)uVar7;
        }
        else if (uVar7 != 0) {
          h->truncated = true;
        }
        uVar3 = uVar3 - 1;
        bVar1 = 0 < (long)uVar11;
        uVar11 = uVar11 - 1;
      } while (bVar1);
    }
    if (uVar6 != 0) {
      do {
        if (uVar3 < 0x300) {
          h->digits[uVar3] = (uint8_t)(uVar6 % 10);
        }
        else if (uVar6 % 10 != 0) {
          h->truncated = true;
        }
        uVar3 = uVar3 - 1;
        bVar1 = 9 < uVar6;
        uVar6 = uVar6 / 10;
      } while (bVar1);
    }
    uVar8 = uVar8 + uVar10;
    uVar3 = 0x300;
    if (uVar8 < 0x300) {
      uVar3 = uVar8;
    }
    h->num_digits = uVar3;
    h->decimal_point = h->decimal_point + uVar10;
    if (uVar8 != 0) {
      iVar4 = -uVar3;
      do {
        uVar3 = uVar3 - 1;
        if (h->digits[uVar3] != '\0') {
          return;
        }
        h->num_digits = uVar3;
        iVar4 = iVar4 + 1;
      } while (iVar4 != 0);
    }
  }
  return;
}

Assistant:

inline void decimal_left_shift(decimal &h, uint32_t shift) {
  if (h.num_digits == 0) {
    return;
  }
  uint32_t num_new_digits = number_of_digits_decimal_left_shift(h, shift);
  int32_t read_index = int32_t(h.num_digits - 1);
  uint32_t write_index = h.num_digits - 1 + num_new_digits;
  uint64_t n = 0;

  while (read_index >= 0) {
    n += uint64_t(h.digits[read_index]) << shift;
    uint64_t quotient = n / 10;
    uint64_t remainder = n - (10 * quotient);
    if (write_index < max_digits) {
      h.digits[write_index] = uint8_t(remainder);
    } else if (remainder > 0) {
      h.truncated = true;
    }
    n = quotient;
    write_index--;
    read_index--;
  }
  while (n > 0) {
    uint64_t quotient = n / 10;
    uint64_t remainder = n - (10 * quotient);
    if (write_index < max_digits) {
      h.digits[write_index] = uint8_t(remainder);
    } else if (remainder > 0) {
      h.truncated = true;
    }
    n = quotient;
    write_index--;
  }
  h.num_digits += num_new_digits;
  if (h.num_digits > max_digits) {
    h.num_digits = max_digits;
  }
  h.decimal_point += int32_t(num_new_digits);
  trim(h);
}